

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O3

void __thiscall antlr::CharScanner::resetText(CharScanner *this)

{
  LexerInputState *pLVar1;
  
  std::__cxx11::string::_M_replace
            ((ulong)&this->text,0,(char *)(this->text)._M_string_length,0x1ecbe9);
  pLVar1 = ((this->inputState).ref)->ptr;
  pLVar1->tokenStartColumn = pLVar1->column;
  pLVar1->tokenStartLine = pLVar1->line;
  return;
}

Assistant:

virtual void resetText()
	{
		text = "";
		inputState->tokenStartColumn = inputState->column;
		inputState->tokenStartLine = inputState->line;
	}